

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O1

void __thiscall Test::Test(Test *this,char *description,Body *body)

{
  size_t *psVar1;
  Registry *pRVar2;
  _List_node_base *p_Var3;
  
  this->description = description;
  std::function<bool_()>::function(&this->body,body);
  pRVar2 = Registry::getInstance();
  p_Var3 = (_List_node_base *)operator_new(0x18);
  p_Var3[1]._M_next = (_List_node_base *)this;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(pRVar2->tests).super__List_base<Test_*,_std::allocator<Test_*>_>._M_impl._M_node.
            _M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

Test::Test(const char *description, Body body)
	: description(description), body(body)
{
	Registry::getInstance().tests.push_back(this);
}